

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlStreamPop(xmlStreamCtxtPtr stream)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (stream != (xmlStreamCtxtPtr)0x0) {
    for (; stream != (xmlStreamCtxtPtr)0x0; stream = stream->next) {
      iVar1 = stream->level;
      if (stream->blockLevel == iVar1) {
        stream->blockLevel = -1;
      }
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = iVar1 + -1;
        stream->level = iVar1;
      }
      iVar2 = stream->nbState;
      uVar3 = iVar2 * 2;
      while( true ) {
        uVar3 = uVar3 - 2;
        if ((iVar2 < 1) || (*(int *)((long)stream->states + ((ulong)uVar3 << 2 | 4)) <= iVar1))
        break;
        iVar2 = iVar2 + -1;
        stream->nbState = iVar2;
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int
xmlStreamPop(xmlStreamCtxtPtr stream) {
    int i, lev;

    if (stream == NULL)
        return(-1);
    while (stream != NULL) {
	/*
	* Reset block-level.
	*/
	if (stream->blockLevel == stream->level)
	    stream->blockLevel = -1;

	/*
	 *  stream->level can be zero when XML_FINAL_IS_ANY_NODE is set
	 *  (see the thread at
	 *  http://mail.gnome.org/archives/xslt/2008-July/msg00027.html)
	 */
	if (stream->level)
	    stream->level--;
	/*
	 * Check evolution of existing states
	 */
	for (i = stream->nbState -1; i >= 0; i--) {
	    /* discard obsoleted states */
	    lev = stream->states[(2 * i) + 1];
	    if (lev > stream->level)
		stream->nbState--;
	    if (lev <= stream->level)
		break;
	}
	stream = stream->next;
    }
    return(0);
}